

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void pstore::database::build_new_store(file_base *file)

{
  atomic<pstore::typed_address<pstore::trailer>_> aVar1;
  uint32_t uVar2;
  int iVar3;
  typed_address<pstore::trailer> tVar4;
  long lVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  trailer local_c0;
  lock_block lb;
  header header;
  undefined4 extraout_var;
  
  (*file->_vptr_file_base[6])(file,0);
  pstore::header::header(&header);
  LOCK();
  header.footer_pos._M_i.a_.a_ = (typed_address<pstore::trailer>)(address)0x40;
  UNLOCK();
  pstore::file::file_base::write<pstore::header,void>(file,&header);
  lb.vacuum_lock = 0x6b4c6d7575636156;
  lb.transaction_lock = 0x4c746361736e7254;
  pstore::file::file_base::write<pstore::lock_block,void>(file,&lb);
  aVar1 = header.footer_pos;
  tVar4.a_.a_._0_4_ = (*file->_vptr_file_base[7])(file);
  tVar4.a_.a_._4_4_ = extraout_var;
  if (aVar1._M_i.a_.a_ != (typed_address<pstore::trailer>)tVar4.a_.a_) {
    assert_failed("header.footer_pos.load () == typed_address<trailer>::make (file.tell ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                  ,0xea);
  }
  builtin_memcpy(local_c0.a.signature1._M_elems,"hPPyfooT",8);
  local_c0.a.generation.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0x0;
  local_c0.a.unused1 = 0;
  local_c0.a.size.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_c0.a.time.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_c0.a.prev_generation.a_.a_ = (address)0;
  local_c0.a.index_records._M_elems[0].a_.a_ = (address)0;
  local_c0.a.index_records._M_elems[1].a_.a_ = (address)0;
  local_c0.a.index_records._M_elems[2].a_.a_ = (address)0;
  local_c0.a.index_records._M_elems[3].a_.a_ = (address)0;
  local_c0.a.index_records._M_elems[4].a_.a_ = (address)0;
  local_c0.a.index_records._M_elems[5].a_.a_ = (address)0;
  local_c0.a.unused2 = 0;
  local_c0.a.unused3 = 0;
  local_c0.crc = 0;
  local_c0.unused1 = 0;
  builtin_memcpy(local_c0.signature2._M_elems,"hPPyTail",8);
  for (lVar5 = 0x28; lVar5 != 0x58; lVar5 = lVar5 + 8) {
    *(undefined8 *)(local_c0.a.signature1._M_elems + lVar5) = 0;
  }
  local_c0.a.time.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)milliseconds_since_epoch();
  LOCK();
  UNLOCK();
  uVar2 = trailer::get_crc(&local_c0);
  local_c0.crc = uVar2;
  pstore::file::file_base::write<pstore::trailer,void>(file,&local_c0);
  iVar3 = (*file->_vptr_file_base[9])(file);
  if (CONCAT44(extraout_var_00,iVar3) == 0xb0) {
    iVar3 = (*file->_vptr_file_base[9])(file);
    if (CONCAT44(extraout_var_01,iVar3) < 0x400000) {
      (*file->_vptr_file_base[10])(file,0x400000);
    }
    return;
  }
  assert_failed("file.size () == leader_size + sizeof (trailer)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0xf5);
}

Assistant:

void database::build_new_store (file::file_base & file) {
        // Write the inital header, lock block, and footer to the file.
        {
            file.seek (0);

            header header{};
            header.footer_pos = typed_address<trailer>::make (leader_size);
            file.write (header);

            lock_block const lb{};
            file.write (lb);

            PSTORE_ASSERT (header.footer_pos.load () ==
                           typed_address<trailer>::make (file.tell ()));

            trailer t{};
            std::fill (std::begin (t.a.index_records), std::end (t.a.index_records),
                       typed_address<index::header_block>::null ());
            t.a.time = milliseconds_since_epoch ();
            t.crc = t.get_crc ();
            file.write (t);
        }
        // Make sure that the file is at least large enough for the minimum region size.
        {
            PSTORE_ASSERT (file.size () == leader_size + sizeof (trailer));
            // TODO: ask the region factory what the min region size is.
            if (file.size () < storage::min_region_size && !database::small_files_enabled ()) {
                file.truncate (storage::min_region_size);
            }
        }
    }